

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O1

RowVector __thiscall
rek::Solver::solve(Solver *this,Matrix<double,__1,__1,_0,__1,__1> *AColMajor,
                  Matrix<double,__1,__1,_1,__1,__1> *ARowMajor,RowVector *b,long maxIterations,
                  double tolerance)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double *pdVar4;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar5;
  XprTypeNested pMVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  bool bVar10;
  Index size;
  void *pvVar11;
  undefined8 *puVar12;
  char *pcVar13;
  ulong uVar14;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar15;
  Index extraout_RDX;
  ActualDstType actualDst;
  XprTypeNested pMVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  ulong in_R9;
  ulong uVar20;
  ulong uVar21;
  Scalar SVar22;
  Scalar SVar23;
  double dVar24;
  RowVector RVar25;
  RowVector z;
  scalar_sum_op<double,_double> local_101;
  void *local_100;
  void *local_f8;
  DenseStorage<double,__1,__1,_1,_0> local_f0;
  DenseStorage<double,__1,__1,_1,_0> *local_e0;
  ulong local_d8;
  Matrix<double,__1,__1,_1,__1,__1> *local_d0;
  ulong local_c8;
  Matrix<double,__1,__1,_1,__1,__1> *local_c0;
  undefined1 local_b8 [24];
  variable_if_dynamic<long,__1> local_a0;
  variable_if_dynamic<long,__1> local_98;
  variable_if_dynamic<long,__1> local_90;
  variable_if_dynamic<long,__1> local_88;
  XprTypeNested local_80;
  ulong local_70;
  Matrix<double,__1,__1,_0,__1,__1> *local_68;
  undefined1 local_60 [32];
  variable_if_dynamic<long,__1> local_40;
  double local_38;
  
  local_c0 = (Matrix<double,__1,__1,_1,__1,__1> *)
             (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar20 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
           m_cols;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 2) = 0;
  local_e0 = (DenseStorage<double,__1,__1,_1,_0> *)maxIterations;
  local_68 = AColMajor;
  local_38 = tolerance;
  if (-1 < (long)uVar20) {
    local_70 = in_R9;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar20,uVar20,1);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_f0,local_e0);
    pMVar15 = (Matrix<double,__1,__1,_1,__1,__1> *)
              (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_rows;
    local_d0 = pMVar15;
    if ((long)pMVar15 < 0) goto LAB_00104047;
    if (pMVar15 == (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
      pvVar11 = (void *)0x0;
    }
    else {
      if ((Matrix<double,__1,__1,_1,__1,__1> *)0x1fffffffffffffff < pMVar15) {
LAB_0010381f:
        puVar12 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar12 = srand;
        __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pvVar11 = malloc((long)pMVar15 * 8);
      if (pMVar15 != (Matrix<double,__1,__1,_1,__1,__1> *)0x1 && ((ulong)pvVar11 & 0xf) != 0)
      goto LAB_00104066;
      if (pvVar11 == (void *)0x0) goto LAB_0010381f;
    }
    uVar21 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
             .m_cols;
    local_d8 = uVar21;
    if (-1 < (long)uVar21) {
      local_100 = pvVar11;
      if (uVar21 != 0) {
        if (uVar21 < 0x2000000000000000) {
          local_f8 = malloc(uVar21 * 8);
          if (uVar21 != 1 && ((ulong)local_f8 & 0xf) != 0) {
LAB_00104066:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (local_f8 != (void *)0x0) goto LAB_001038db;
        }
        puVar12 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar12 = srand;
        __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_f8 = (void *)0x0;
LAB_001038db:
      lVar18 = *(long *)(this + 2);
      local_c8 = uVar20;
      if (lVar18 < 0) {
        pcVar13 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
        ;
LAB_00103fba:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar13);
      }
      if (lVar18 != 0) {
        memset(*(void **)this,0,lVar18 << 3);
      }
      if (0 < (long)local_c0) {
        pMVar15 = (Matrix<double,__1,__1,_1,__1,__1> *)0x0;
        pvVar11 = local_100;
        do {
          pdVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pMVar5 = (Matrix<double,__1,__1,_1,__1,__1> *)
                   b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          if ((long)pMVar5 < 0 && pdVar4 != (double *)0x0) goto LAB_00103eb0;
          if ((b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)pMVar15) goto LAB_00103ec7;
          local_b8._0_8_ = pdVar4 + (long)pMVar5 * (long)pMVar15;
          local_90.m_value = 0;
          local_b8._16_8_ = pMVar5;
          local_a0.m_value = (long)b;
          local_98.m_value = (long)pMVar15;
          local_88.m_value = (long)pMVar5;
          if (pMVar5 == (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
            SVar22 = 0.0;
          }
          else {
            if ((long)pMVar5 < 1) {
              pcVar13 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              goto LAB_0010403d;
            }
            local_60._8_8_ = local_b8._0_8_;
            local_60._24_8_ = pMVar5;
            SVar22 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                                 *)local_60,&local_101,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                                 *)local_b8);
            pvVar11 = local_100;
          }
          if (local_d0 == pMVar15) goto LAB_00103e91;
          *(Scalar *)((long)pvVar11 + (long)pMVar15 * 8) = SVar22;
          pMVar15 = (Matrix<double,__1,__1,_1,__1,__1> *)
                    ((long)&(pMVar15->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                            m_storage.m_data + 1);
        } while (local_c0 != pMVar15);
      }
      if (local_c8 != 0) {
        uVar20 = 1;
        if (1 < (long)local_c8) {
          uVar20 = local_c8;
        }
        uVar21 = 0;
        do {
          pdVar4 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_data;
          pMVar15 = (Matrix<double,__1,__1,_1,__1,__1> *)
                    (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                    m_storage.m_rows;
          if ((long)pMVar15 < 0 && pdVar4 != (double *)0x0) goto LAB_00103ede;
          if ((ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_cols <= (long)uVar21) goto LAB_00103efd;
          local_b8._0_8_ = pdVar4 + (long)pMVar15 * uVar21;
          local_98.m_value = 0;
          local_b8._8_8_ = pMVar15;
          local_a0.m_value = (long)ARowMajor;
          local_90.m_value = uVar21;
          local_88.m_value = (long)pMVar15;
          if (pMVar15 == (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
            SVar23 = 0.0;
          }
          else {
            if ((long)pMVar15 < 1) {
              pcVar13 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              goto LAB_0010403d;
            }
            local_60._8_8_ = local_b8._0_8_;
            local_60._24_8_ = pMVar15;
            SVar23 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                                 *)local_60,&local_101,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                 *)local_b8);
          }
          if (local_d8 == uVar21) goto LAB_00103e91;
          *(Scalar *)((long)local_f8 + uVar21 * 8) = SVar23;
          uVar21 = uVar21 + 1;
        } while (uVar20 != uVar21);
      }
      if (0 < (long)local_70) {
        uVar20 = 0;
        do {
          uVar21 = uVar20 + 1;
          if ((long)uVar21 %
              (long)*(int *)&(local_68->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_data == 0) {
            bVar10 = hasConvergedDense((Solver *)local_68,(Matrix<double,__1,__1,_1,__1,__1> *)b,
                                       (Matrix<double,__1,__1,_0,__1,__1> *)ARowMajor,
                                       (RowVector *)this,(RowVector *)local_e0,
                                       (RowVector *)&local_f0,local_38);
            if (bVar10) break;
          }
          uVar14 = (long)uVar20 % (long)local_c0;
          pMVar15 = (Matrix<double,__1,__1,_1,__1,__1> *)(uVar20 % local_c8);
          pdVar4 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_data;
          pMVar6 = (XprTypeNested)
                   (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_rows;
          if ((long)pMVar6 < 0 && pdVar4 != (double *)0x0) goto LAB_00103ede;
          if ((ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_cols <= (long)pMVar15) goto LAB_00103efd;
          if ((XprTypeNested)local_f0.m_rows != pMVar6) {
            pcVar13 = 
            "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
            ;
LAB_00103f7c:
            __assert_fail("size() == other.size()","/usr/include/eigen3/Eigen/src/Core/Dot.h",0x52,
                          pcVar13);
          }
          local_b8._8_8_ = pdVar4 + (long)pMVar6 * (long)pMVar15;
          local_b8._0_8_ = &local_f0;
          local_90.m_value = 0;
          local_b8._16_8_ = pMVar6;
          local_98.m_value = (long)ARowMajor;
          local_88.m_value = (long)pMVar15;
          local_80 = pMVar6;
          if (pMVar6 == (XprTypeNested)0x0) {
            dVar24 = 0.0;
          }
          else {
            if ((long)pMVar6 < 1) {
              pcVar13 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              local_98.m_value = (long)ARowMajor;
LAB_0010403d:
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar13);
            }
            local_60._8_8_ = local_f0.m_data;
            local_40.m_value =
                 (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                 m_storage.m_rows;
            local_60._16_8_ = local_b8._8_8_;
            dVar24 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                                 *)local_60,&local_101,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                 *)local_b8);
          }
          if ((long)local_d8 <= (long)pMVar15) {
LAB_00103e91:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar4 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_data;
          pMVar6 = (XprTypeNested)
                   (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_rows;
          if ((long)pMVar6 < 0 && pdVar4 != (double *)0x0) goto LAB_00103ede;
          if ((ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_cols <= (long)pMVar15) goto LAB_00103efd;
          if ((long)pMVar6 < 0) {
            pcVar13 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_00103fba;
          }
          if ((XprTypeNested)local_f0.m_rows != pMVar6) {
            pcVar13 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>, Functor = Eigen::internal::add_assign_op<double, double>]"
            ;
LAB_00103fd9:
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar13);
          }
          dVar24 = -dVar24 / *(double *)((long)local_f8 + (long)pMVar15 * 8);
          pMVar16 = (XprTypeNested)
                    (local_f0.m_rows - (local_f0.m_rows >> 0x3f) & 0xfffffffffffffffe);
          if (1 < local_f0.m_rows) {
            lVar18 = 0;
            do {
              dVar9 = (pdVar4 + (long)pMVar6 * (long)pMVar15 + lVar18)[1];
              dVar3 = (double)((double **)local_f0.m_data + lVar18)[1];
              ((double **)local_f0.m_data)[lVar18] =
                   (double *)
                   (pdVar4[(long)pMVar6 * (long)pMVar15 + lVar18] * dVar24 +
                   (double)((double **)local_f0.m_data)[lVar18]);
              ((double **)local_f0.m_data + lVar18)[1] = (double *)(dVar9 * dVar24 + dVar3);
              lVar18 = lVar18 + 2;
            } while (lVar18 < (long)pMVar16);
          }
          if ((long)pMVar16 < local_f0.m_rows) {
            do {
              ((double **)local_f0.m_data)[(long)pMVar16] =
                   (double *)
                   (pdVar4[(long)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                            *)&pMVar16->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          )->m_storage).m_data + (long)pMVar6 * (long)pMVar15)] *
                    dVar24 + (double)((double **)local_f0.m_data)[(long)pMVar16]);
              pMVar16 = (XprTypeNested)
                        ((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                                 &pMVar16->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                                ->m_storage).m_data + 1);
            } while ((XprTypeNested)local_f0.m_rows != pMVar16);
          }
          pdVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pMVar6 = (XprTypeNested)
                   b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          if ((long)pMVar6 < 0 && pdVar4 != (double *)0x0) goto LAB_00103eb0;
          if ((b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar14) goto LAB_00103ec7;
          if (*(XprTypeNested *)(this + 2) != pMVar6) {
            pcVar13 = 
            "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>]"
            ;
            goto LAB_00103f7c;
          }
          local_b8._8_8_ = pdVar4 + (long)pMVar6 * uVar14;
          local_88.m_value = 0;
          local_b8._0_8_ = this;
          local_a0.m_value = (long)pMVar6;
          local_98.m_value = (long)b;
          local_90.m_value = uVar14;
          local_80 = pMVar6;
          if (pMVar6 == (XprTypeNested)0x0) {
            dVar24 = 0.0;
          }
          else {
            if ((long)pMVar6 < 1) {
              pcVar13 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              local_98.m_value = (long)b;
              goto LAB_0010403d;
            }
            local_60._8_8_ = *(undefined8 *)this;
            local_40.m_value =
                 (long)b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                       .m_data;
            local_60._16_8_ = local_b8._8_8_;
            dVar24 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                                 *)local_60,&local_101,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                                 *)local_b8);
          }
          if (local_e0->m_rows <= (long)uVar14) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          if ((local_f0.m_rows <= (long)uVar14) || ((long)local_d0 <= (long)uVar14))
          goto LAB_00103e91;
          pdVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pdVar7 = b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          if ((long)pdVar7 < 0 && pdVar4 != (double *)0x0) goto LAB_00103eb0;
          if ((b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar14) goto LAB_00103ec7;
          if ((long)pdVar7 < 0) {
            pcVar13 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
            ;
            goto LAB_00103fba;
          }
          pdVar8 = *(double **)(this + 2);
          if (pdVar8 != pdVar7) {
            pcVar13 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Functor = Eigen::internal::add_assign_op<double, double>]"
            ;
            goto LAB_00103fd9;
          }
          dVar24 = ((local_e0->m_data[uVar14] - (double)((double **)local_f0.m_data)[uVar14]) -
                   dVar24) / *(double *)((long)local_100 + uVar14 * 8);
          lVar18 = *(long *)this;
          pdVar17 = (double *)((long)pdVar8 - ((long)pdVar8 >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)pdVar8) {
            lVar19 = 0;
            do {
              dVar9 = (pdVar4 + (long)pdVar7 * uVar14 + lVar19)[1];
              pdVar1 = (double *)(lVar18 + lVar19 * 8);
              dVar3 = pdVar1[1];
              pdVar2 = (double *)(lVar18 + lVar19 * 8);
              *pdVar2 = pdVar4[(long)pdVar7 * uVar14 + lVar19] * dVar24 + *pdVar1;
              pdVar2[1] = dVar9 * dVar24 + dVar3;
              lVar19 = lVar19 + 2;
            } while (lVar19 < (long)pdVar17);
          }
          if ((long)pdVar17 < (long)pdVar8) {
            do {
              *(double *)(lVar18 + (long)pdVar17 * 8) =
                   pdVar4[(long)((long)pdVar7 * uVar14 + (long)pdVar17)] * dVar24 +
                   *(double *)(lVar18 + (long)pdVar17 * 8);
              pdVar17 = (double *)((long)pdVar17 + 1);
            } while (pdVar8 != pdVar17);
          }
          uVar20 = uVar21;
        } while (uVar21 != local_70);
      }
      free(local_f8);
      free(local_100);
      free(local_f0.m_data);
      RVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      RVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this;
      return (RowVector)
             RVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
  }
LAB_00104047:
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
LAB_00103ede:
  pcVar13 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
  ;
  goto LAB_00103ef3;
LAB_00103efd:
  pcVar13 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
  ;
  goto LAB_00103f12;
LAB_00103eb0:
  pcVar13 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
  ;
LAB_00103ef3:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar13);
LAB_00103ec7:
  pcVar13 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
  ;
LAB_00103f12:
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,pcVar13);
}

Assistant:

RowVector solve(Matrix<double, Dynamic, Dynamic, ColMajor> &AColMajor,
                  Matrix<double, Dynamic, Dynamic, RowMajor> &ARowMajor,
                  const RowVector &b, long maxIterations,
                  double tolerance = tolerance_) const {
    const long m = ARowMajor.rows(), n = AColMajor.cols();
    RowVector x(AColMajor.cols());
    RowVector z(b);
    RowVector rowNorms(AColMajor.rows());
    RowVector columnNorms(AColMajor.cols());

    x.setZero();

    for (long i = 0; i < m; i++) {
      rowNorms(i) = ARowMajor.row(i).squaredNorm();
    }

    for (long j = 0; j < n; j++) {
      columnNorms(j) = AColMajor.col(j).squaredNorm();
    }

    for (long k = 0; k < maxIterations; k++) {
      // Check for convergence every blockSize_ iterations
      if ((k + 1) % blockSize_ == 0 &&
          hasConvergedDense(ARowMajor, AColMajor, x, b, z, tolerance)) {
        break;
      }

      // Extended Kaczmarz
      const long i_k = k % m;
      const long j_k = k % n;

      double val = -z.dot(AColMajor.col(j_k)) / columnNorms(j_k);
      z += val * AColMajor.col(j_k);
      val = x.dot(ARowMajor.row(i_k));
      val = (b(i_k) - z(i_k) - val) / rowNorms(i_k);

      x += val * ARowMajor.row(i_k);
    }
    return x;
  }